

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield_cpu.cpp
# Opt level: O0

void __thiscall
MeanField::CPU::CRF::CRF
          (CRF *this,int width,int height,int dimensions,float spatialSD,float bilateralSpatialSD,
          float bilateralIntensitySD,bool separable)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  ulong uVar8;
  float *pfVar9;
  type pfVar10;
  pointer pfVar11;
  int local_44;
  int local_40;
  int j;
  int i;
  bool separable_local;
  float bilateralIntensitySD_local;
  float bilateralSpatialSD_local;
  float spatialSD_local;
  int dimensions_local;
  int height_local;
  int width_local;
  CRF *this_local;
  
  MeanField::CRF::CRF(&this->super_CRF);
  (this->super_CRF)._vptr_CRF = (_func_int **)&PTR_filterGaussian_0010b938;
  this->width = width;
  this->height = height;
  this->dimensions = dimensions;
  this->spatialSD = spatialSD;
  this->bilateralSpatialSD = bilateralSpatialSD;
  this->bilateralIntensitySD = bilateralIntensitySD;
  this->spatialWeight = 1.0;
  this->bilateralWeight = 1.0;
  this->separable = separable;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(width * height * dimensions);
  uVar8 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pfVar9 = (float *)operator_new__(uVar8);
  memset(pfVar9,0,uVar8);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->QDistribution,pfVar9);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(width * height * dimensions);
  uVar8 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pfVar9 = (float *)operator_new__(uVar8);
  memset(pfVar9,0,uVar8);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->QDistributionTmp,pfVar9);
  uVar8 = (ulong)(uint)(dimensions * dimensions) << 2;
  pfVar9 = (float *)operator_new__(uVar8);
  memset(pfVar9,0,uVar8);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->pottsModel,pfVar9);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(width * height * dimensions);
  uVar8 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pfVar9 = (float *)operator_new__(uVar8);
  memset(pfVar9,0,uVar8);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->gaussianOut,pfVar9);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(width * height * dimensions);
  uVar8 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pfVar9 = (float *)operator_new__(uVar8);
  memset(pfVar9,0,uVar8);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->bilateralOut,pfVar9);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(width * height * dimensions);
  uVar8 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pfVar9 = (float *)operator_new__(uVar8);
  memset(pfVar9,0,uVar8);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->aggregatedFilters,pfVar9);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)(width * height * dimensions);
  uVar8 = SUB168(auVar6 * ZEXT816(4),0);
  if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pfVar9 = (float *)operator_new__(uVar8);
  memset(pfVar9,0,uVar8);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->filterOutTmp,pfVar9);
  pfVar9 = (float *)operator_new__(0x400);
  memset(pfVar9,0,0x400);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->spatialKernel,pfVar9);
  pfVar9 = (float *)operator_new__(0x400);
  memset(pfVar9,0,0x400);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->bilateralSpatialKernel,
             pfVar9);
  pfVar9 = (float *)operator_new__(0x400);
  memset(pfVar9,0,0x400);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->bilateralIntensityKernel,
             pfVar9);
  for (local_40 = 0; local_40 < dimensions; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < dimensions; local_44 = local_44 + 1) {
      fVar7 = -1.0;
      if (local_40 != local_44) {
        fVar7 = 0.0;
      }
      pfVar10 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                          (&this->pottsModel,(long)(local_40 * dimensions + local_44));
      *pfVar10 = fVar7;
    }
  }
  pfVar11 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->spatialKernel);
  Filtering::generateGaussianKernel(pfVar11,0x100,spatialSD);
  pfVar11 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                      (&this->bilateralSpatialKernel);
  Filtering::generateGaussianKernel(pfVar11,0x100,bilateralSpatialSD);
  pfVar11 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                      (&this->bilateralIntensityKernel);
  Filtering::generateGaussianKernel(pfVar11,0x100,bilateralIntensitySD);
  return;
}

Assistant:

CRF::CRF(int width, int height, int dimensions, float spatialSD,
    float bilateralSpatialSD, float bilateralIntensitySD, bool separable) :
    width(width), height(height), dimensions(dimensions),
    spatialWeight(1.0), bilateralWeight(1.0),
    spatialSD(spatialSD), bilateralSpatialSD(bilateralSpatialSD),
    bilateralIntensitySD(bilateralIntensitySD),
    separable(separable),
    QDistribution(new float[width*height*dimensions]()),
    QDistributionTmp(new float[width*height*dimensions]()),
    pottsModel(new float[dimensions*dimensions]()),
    gaussianOut(new float[width*height*dimensions]()),
    bilateralOut(new float[width*height*dimensions]()),
    aggregatedFilters(new float[width*height*dimensions]()),
    filterOutTmp(new float[width*height*dimensions]()),
    spatialKernel(new float[KERNEL_SIZE]()),
    bilateralSpatialKernel(new float[KERNEL_SIZE]()),
    bilateralIntensityKernel(new float[KERNEL_SIZE]()) {

    //Initialise potts model.
    for (int i = 0; i < dimensions; i++) {
        for (int j = 0; j < dimensions; j++) {
            pottsModel[i*dimensions + j] = (i == j) ? -1.0 : 0.0;
        }
    }

    //Initialise kernels.
    generateGaussianKernel(spatialKernel.get(), KERNEL_SIZE, spatialSD);
    generateGaussianKernel(bilateralSpatialKernel.get(), KERNEL_SIZE, bilateralSpatialSD);
    generateGaussianKernel(bilateralIntensityKernel.get(), KERNEL_SIZE, bilateralIntensitySD);
}